

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O2

Cnf_Dat_t * Cnf_DataReadFromFile(char *pFileName)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *__s;
  char *pcVar5;
  Vec_Int_t *p;
  Cnf_Dat_t *pCVar6;
  int **ppiVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  uint uVar11;
  Vec_Int_t *local_70;
  Vec_Int_t *local_68;
  Vec_Int_t *local_60;
  char *local_58;
  ulong local_50;
  ulong local_48;
  FILE *local_40;
  char *local_38;
  
  local_40 = fopen(pFileName,"rb");
  if (local_40 == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return (Cnf_Dat_t *)0x0;
  }
  __s = (char *)malloc(1000000);
  local_38 = __s + 1;
  p = (Vec_Int_t *)0x0;
  uVar8 = 0xffffffffffffffff;
  local_70 = (Vec_Int_t *)0x0;
  local_50 = 0xffffffff;
  uVar11 = 0;
  local_58 = __s;
  do {
    local_48 = uVar8;
LAB_00444330:
    do {
      pcVar5 = fgets(__s,1000000,local_40);
      local_68 = p;
      if (pcVar5 == (char *)0x0) {
        local_60 = local_70;
        uVar11 = (uint)local_50;
        if (local_70->nSize != uVar11) {
          printf("Warning! The number of clauses (%d) is different from declaration (%d).\n",
                 (ulong)(uint)local_70->nSize,local_50 & 0xffffffff);
        }
        Vec_IntPush(local_70,p->nSize);
        pCVar6 = (Cnf_Dat_t *)calloc(1,0x48);
        pCVar6->nVars = (int)local_48;
        pCVar6->nClauses = uVar11;
        pCVar6->nLiterals = p->nSize;
        uVar11 = local_70->nSize;
        ppiVar7 = (int **)malloc((long)(int)uVar11 << 3);
        pCVar6->pClauses = ppiVar7;
        piVar1 = p->pArray;
        p->nCap = 0;
        p->nSize = 0;
        p->pArray = (int *)0x0;
        *ppiVar7 = piVar1;
        uVar8 = 0;
        uVar9 = 0;
        if (0 < (int)uVar11) {
          uVar9 = (ulong)uVar11;
        }
        for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
          ppiVar7[uVar8] = *ppiVar7 + local_70->pArray[uVar8];
        }
        goto LAB_0044449c;
      }
      uVar11 = uVar11 + 1;
    } while (*__s == 'c');
    if (*__s != 'p') {
      pcVar5 = strtok(__s," \t\r\n");
      if (pcVar5 != (char *)0x0) {
        Vec_IntPush(local_70,p->nSize);
        bVar10 = true;
        while (__s = local_58, pcVar5 != (char *)0x0) {
          uVar2 = atoi(pcVar5);
          __s = local_58;
          if (uVar2 == 0) goto LAB_00444330;
          if ((int)uVar2 < 1) {
            uVar2 = ~uVar2 * 2 + 1;
          }
          else {
            uVar2 = uVar2 * 2 - 2;
          }
          if (SBORROW4(uVar2,(int)uVar8 * 2) == (int)(uVar2 + (int)uVar8 * -2) < 0) {
            local_60 = local_70;
            pCVar6 = (Cnf_Dat_t *)0x0;
            printf("Literal %d is out-of-bound for %d variables.\n",(ulong)uVar2,local_48);
            __s = local_58;
            goto LAB_0044449c;
          }
          Vec_IntPush(p,uVar2);
          bVar10 = false;
          pcVar5 = strtok((char *)0x0," \t\r\n");
        }
        if (!bVar10) {
          local_60 = local_70;
          pCVar6 = (Cnf_Dat_t *)0x0;
          printf("There is no zero-terminator in line %d.\n",(ulong)uVar11);
          goto LAB_0044449c;
        }
      }
      goto LAB_00444330;
    }
    pcVar5 = strtok(local_38," \t");
    iVar3 = strcmp(pcVar5,"cnf");
    if (iVar3 != 0) {
      pcVar5 = "Incorrect input file.";
      goto LAB_004445f3;
    }
    pcVar5 = strtok((char *)0x0," \t");
    uVar2 = atoi(pcVar5);
    uVar8 = (ulong)uVar2;
    pcVar5 = strtok((char *)0x0," \t");
    uVar4 = atoi(pcVar5);
    if (((int)uVar2 < 1) || ((int)uVar4 < 1)) {
      pcVar5 = "Incorrect parameters.";
LAB_004445f3:
      local_60 = local_70;
      puts(pcVar5);
      pCVar6 = (Cnf_Dat_t *)0x0;
LAB_0044449c:
      fclose(local_40);
      Vec_IntFreeP(&local_60);
      Vec_IntFreeP(&local_68);
      free(__s);
      return pCVar6;
    }
    local_70 = Vec_IntAlloc(uVar4 + 1);
    local_50 = (ulong)uVar4;
    p = Vec_IntAlloc(uVar4 << 3);
  } while( true );
}

Assistant:

Cnf_Dat_t * Cnf_DataReadFromFile( char * pFileName )
{
    int MaxLine = 1000000;
    int Var, Lit, nVars = -1, nClas = -1, i, Entry, iLine = 0;
    Cnf_Dat_t * pCnf = NULL;
    Vec_Int_t * vClas = NULL;
    Vec_Int_t * vLits = NULL;
    char * pBuffer, * pToken;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return NULL;
    }
    pBuffer = ABC_ALLOC( char, MaxLine );
    while ( fgets(pBuffer, MaxLine, pFile) != NULL )
    {
        iLine++;
        if ( pBuffer[0] == 'c' )
            continue;
        if ( pBuffer[0] == 'p' )
        {
            pToken = strtok( pBuffer+1, " \t" );
            if ( strcmp(pToken, "cnf") )
            {
                printf( "Incorrect input file.\n" );
                goto finish;
            }
            pToken = strtok( NULL, " \t" );
            nVars = atoi( pToken );
            pToken = strtok( NULL, " \t" );
            nClas = atoi( pToken );
            if ( nVars <= 0 || nClas <= 0 )
            {
                printf( "Incorrect parameters.\n" );
                goto finish;
            }
            // temp storage
            vClas = Vec_IntAlloc( nClas+1 );
            vLits = Vec_IntAlloc( nClas*8 );
            continue;
        }
        pToken = strtok( pBuffer, " \t\r\n" );
        if ( pToken == NULL )
            continue;
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        while ( pToken )
        {
            Var = atoi( pToken );
            if ( Var == 0 )
                break;
            Lit = (Var > 0) ? Abc_Var2Lit(Var-1, 0) : Abc_Var2Lit(-Var-1, 1);
            if ( Lit >= 2*nVars )
            {
                printf( "Literal %d is out-of-bound for %d variables.\n", Lit, nVars );
                goto finish;
            }
            Vec_IntPush( vLits, Lit );
            pToken = strtok( NULL, " \t\r\n" );
        }
        if ( Var != 0 )
        {
            printf( "There is no zero-terminator in line %d.\n", iLine );
            goto finish;
        }
    }
    // finalize
    if ( Vec_IntSize(vClas) != nClas )
        printf( "Warning! The number of clauses (%d) is different from declaration (%d).\n", Vec_IntSize(vClas), nClas );
    Vec_IntPush( vClas, Vec_IntSize(vLits) );
    // create
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->nVars     = nVars;
    pCnf->nClauses  = nClas;
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->pClauses  = ABC_ALLOC( int *, Vec_IntSize(vClas) );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
finish:
    fclose( pFile );
    Vec_IntFreeP( &vClas );
    Vec_IntFreeP( &vLits );
    ABC_FREE( pBuffer );
    return pCnf;
}